

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O1

const_iterator __thiscall
ArgumentParser::KeywordActionMap::Find(KeywordActionMap *this,string_view name)

{
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
  *ppVar1;
  size_t __n;
  int iVar2;
  ulong __n_00;
  ulong uVar3;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
  *ppVar4;
  difference_type __d;
  ulong uVar5;
  long lVar7;
  ulong uVar6;
  
  uVar3 = name._M_len;
  ppVar4 = (this->
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           ).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           ).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (long)ppVar1 - (long)ppVar4) {
    uVar6 = ((ulong)((long)ppVar1 - (long)ppVar4) >> 4) * -0x5555555555555555;
    do {
      uVar5 = uVar6 >> 1;
      __n_00 = ppVar4[uVar5].first._M_len;
      lVar7 = __n_00 - uVar3;
      if (uVar3 <= __n_00) {
        __n_00 = uVar3;
      }
      if (__n_00 == 0) {
        iVar2 = 0;
      }
      else {
        iVar2 = memcmp(ppVar4[uVar5].first._M_str,name._M_str,__n_00);
      }
      if (iVar2 == 0) {
        if (lVar7 < -0x7fffffff) {
          lVar7 = -0x80000000;
        }
        if (0x7ffffffe < lVar7) {
          lVar7 = 0x7fffffff;
        }
        iVar2 = (int)lVar7;
      }
      if (iVar2 < 0) {
        ppVar4 = ppVar4 + uVar5 + 1;
        uVar5 = ~uVar5 + uVar6;
      }
      uVar6 = uVar5;
    } while (0 < (long)uVar5);
  }
  if ((ppVar4 != ppVar1) && (__n = (ppVar4->first)._M_len, __n == uVar3)) {
    if (__n == 0) {
      return (const_iterator)ppVar4;
    }
    iVar2 = bcmp((ppVar4->first)._M_str,name._M_str,__n);
    if (iVar2 == 0) {
      return (const_iterator)ppVar4;
    }
  }
  return (const_iterator)ppVar1;
}

Assistant:

auto KeywordActionMap::Find(cm::string_view name) const -> const_iterator
{
  auto const it =
    std::lower_bound(this->begin(), this->end(), name,
                     [](value_type const& elem, cm::string_view const& k) {
                       return elem.first < k;
                     });
  return (it != this->end() && it->first == name) ? it : this->end();
}